

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_mdl.h
# Opt level: O0

void __thiscall
ExampleModel::
WriteDVarExpr<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::ExprArgWriter>
          (ExampleModel *this,int i,ExprArgWriter *ew)

{
  Opcode oc;
  Opcode oc_00;
  Opcode oc_01;
  ExprArgWriter *this_00;
  uint in_ESI;
  ExprArgWriter ew01_2;
  ExprArgWriter ew01_1;
  ExprArgWriter ew0101;
  ExprArgWriter ew01;
  ExprArgWriter *in_stack_ffffffffffffff48;
  ExprArgWriter *pEVar1;
  ExprArgWriter *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  ExprArgWriter *in_stack_ffffffffffffff68;
  ExprArgWriter local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  ExprArgWriter local_68 [2];
  ExprArgWriter local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  ExprArgWriter local_28 [2];
  
  this_00 = (ExprArgWriter *)(ulong)in_ESI;
  switch(this_00) {
  case (ExprArgWriter *)0x0:
    local_38 = 0xf;
    uStack_30 = 0x141601;
    pEVar1 = local_28;
    oc.name._0_4_ = (int)pEVar1;
    oc._0_8_ = in_stack_ffffffffffffff50;
    oc.name._4_4_ = (int)((ulong)pEVar1 >> 0x20);
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    OPut1<mp::nl::Opcode>(in_stack_ffffffffffffff48,oc);
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::OPut2
              (in_stack_ffffffffffffff68,(int)((ulong)this_00 >> 0x20),(char *)pEVar1);
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
              (in_stack_ffffffffffffff50,(double)in_stack_ffffffffffffff48);
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::VPut
              (this_00,(int)((ulong)pEVar1 >> 0x20),(char *)in_stack_ffffffffffffff50);
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    ~ExprArgWriter(&local_48);
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    ~ExprArgWriter(local_28);
    break;
  case (ExprArgWriter *)0x1:
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
              (in_stack_ffffffffffffff50,(double)in_stack_ffffffffffffff48);
    break;
  case (ExprArgWriter *)0x2:
    local_78 = 0;
    uStack_70 = 0x1415f6;
    pEVar1 = local_68;
    oc_00.name._0_4_ = in_stack_ffffffffffffff58;
    oc_00._0_8_ = pEVar1;
    oc_00.name._4_4_ = in_stack_ffffffffffffff5c;
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    OPut2<mp::nl::Opcode>(in_stack_ffffffffffffff48,oc_00);
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::VPut
              (this_00,in_stack_ffffffffffffff5c,(char *)pEVar1);
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
              (pEVar1,(double)in_stack_ffffffffffffff48);
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    ~ExprArgWriter(local_68);
    break;
  case (ExprArgWriter *)0x3:
    pEVar1 = &local_88;
    oc_01.name._0_4_ = in_stack_ffffffffffffff58;
    oc_01._0_8_ = in_stack_ffffffffffffff50;
    oc_01.name._4_4_ = in_stack_ffffffffffffff5c;
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    OPut2<mp::nl::Opcode>(pEVar1,oc_01);
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::VPut
              (this_00,in_stack_ffffffffffffff5c,(char *)in_stack_ffffffffffffff50);
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::NPut
              (in_stack_ffffffffffffff50,(double)pEVar1);
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    ~ExprArgWriter(&local_88);
  }
  return;
}

Assistant:

void WriteDVarExpr(int i, EWriter& ew) const {
    using namespace mp::nl;
    switch (i) {
    case 0:                  // nl(t3)
    {
      auto ew01 = ew.OPut1(ABS); // unary opcode
      // The argument:
      {                          // Can also split code / name:
        auto ew0101 = ew01.OPut2(ADD.code, "+"); // binary opcode
        ew0101.NPut(-2);         // 1st arg
        ew0101.VPut(0, "y");     // 2nd arg
      }
    } break;
    case 1:                  // t2
      ew.NPut(0);            // no non-linear part
      break;
    case 2:                  // t3
    {
      auto ew01 = ew.OPut2(ADD);
      ew01.VPut(2, "nl(t3)");
      ew01.NPut(6.38);
    } break;
    case 3:                  // t1
    {
      auto ew01 = ew.OPut2(POW);
      ew01.VPut(0, "y");
      ew01.NPut(2);
    } break;
    default:
      assert(false);
    {}
    }
  }